

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void ecs_bitset_remove(ecs_bitset_t *bs,int32_t elem)

{
  _Bool value;
  _Bool last_value;
  int32_t last;
  int32_t elem_local;
  ecs_bitset_t *bs_local;
  
  _ecs_assert(elem < bs->count,2,(char *)0x0,"elem < bs->count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/bitset.c"
              ,0x54);
  if (elem < bs->count) {
    value = ecs_bitset_get(bs,bs->count + -1);
    ecs_bitset_set(bs,elem,value);
    bs->count = bs->count + -1;
    return;
  }
  __assert_fail("elem < bs->count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/bitset.c"
                ,0x54,"void ecs_bitset_remove(ecs_bitset_t *, int32_t)");
}

Assistant:

void ecs_bitset_remove(
    ecs_bitset_t *bs,
    int32_t elem)
{
    ecs_assert(elem < bs->count, ECS_INVALID_PARAMETER, NULL);
    int32_t last = bs->count - 1;
    bool last_value = ecs_bitset_get(bs, last);
    ecs_bitset_set(bs, elem, last_value);
    bs->count --;
}